

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int apiHandleError(sqlite3 *db,int rc)

{
  uint uVar1;
  
  if ((rc == 0xc0a) || (db->mallocFailed != '\0')) {
    sqlite3OomClear(db);
    uVar1 = 7;
    sqlite3Error(db,7);
  }
  else {
    uVar1 = rc & db->errMask;
  }
  return uVar1;
}

Assistant:

static SQLITE_NOINLINE int apiHandleError(sqlite3 *db, int rc){
  if( db->mallocFailed || rc==SQLITE_IOERR_NOMEM ){
    sqlite3OomClear(db);
    sqlite3Error(db, SQLITE_NOMEM);
    return SQLITE_NOMEM_BKPT;
  }
  return rc & db->errMask;
}